

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

void f8n::debug::Stop(void)

{
  IBackend *pIVar1;
  pointer puVar2;
  pointer puVar3;
  log_queue *this;
  pointer *__ptr;
  pointer puVar4;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> local_28;
  
  local_28._M_device = &mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  local_28._M_owns = true;
  cancel = true;
  if (queue != (log_queue *)0x0 && thread != (thread *)0x0) {
    log_queue::stop(queue);
    std::thread::join();
    if ((thread != (thread *)0x0) && ((thread->_M_id)._M_thread != 0)) {
      std::terminate();
    }
    operator_delete(thread,8);
    this = queue;
    thread = (thread *)0x0;
    if (queue != (log_queue *)0x0) {
      std::condition_variable::~condition_variable(&queue->wait_for_next_item_condition);
      std::_Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>::
      ~_Deque_base((_Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_> *)
                   this);
    }
    operator_delete(this,0xb0);
    queue = (log_queue *)0x0;
  }
  puVar3 = backends.
           super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = backends.
           super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = backends.
           super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (backends.
      super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      backends.
      super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pIVar1 = (puVar4->_M_t).
               super___uniq_ptr_impl<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>
               ._M_t.
               super__Tuple_impl<0UL,_f8n::debug::IBackend_*,_std::default_delete<f8n::debug::IBackend>_>
               .super__Head_base<0UL,_f8n::debug::IBackend_*,_false>._M_head_impl;
      if (pIVar1 != (IBackend *)0x0) {
        (*pIVar1->_vptr_IBackend[1])();
      }
      (puVar4->_M_t).
      super___uniq_ptr_impl<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>._M_t.
      super__Tuple_impl<0UL,_f8n::debug::IBackend_*,_std::default_delete<f8n::debug::IBackend>_>.
      super__Head_base<0UL,_f8n::debug::IBackend_*,_false>._M_head_impl = (IBackend *)0x0;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar3);
    backends.
    super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

log_entry(debug_level l, const std::string& t, const std::string& m) {
                level = l;
                tag = t;
                message = m;
            }